

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void DataTypeApplyOp(ImGuiDataType data_type,int op,void *output,void *arg1,void *arg2)

{
  void *arg2_local;
  void *arg1_local;
  void *output_local;
  int op_local;
  ImGuiDataType data_type_local;
  
  switch(data_type) {
  case 0:
    if (op == 0x2b) {
      *(int *)output = *arg1 + *arg2;
    }
    else if (op == 0x2d) {
      *(int *)output = *arg1 - *arg2;
    }
    break;
  case 1:
    if (op == 0x2b) {
      *(int *)output = *arg1 + *arg2;
    }
    else if (op == 0x2d) {
      *(int *)output = *arg1 - *arg2;
    }
    break;
  case 2:
    if (op == 0x2b) {
      *(long *)output = *arg1 + *arg2;
    }
    else if (op == 0x2d) {
      *(long *)output = *arg1 - *arg2;
    }
    break;
  case 3:
    if (op == 0x2b) {
      *(long *)output = *arg1 + *arg2;
    }
    else if (op == 0x2d) {
      *(long *)output = *arg1 - *arg2;
    }
    break;
  case 4:
    if (op == 0x2b) {
      *(float *)output = *arg1 + *arg2;
    }
    else if (op == 0x2d) {
      *(float *)output = *arg1 - *arg2;
    }
    break;
  case 5:
    if (op == 0x2b) {
      *(double *)output = *arg1 + *arg2;
    }
    else if (op == 0x2d) {
      *(double *)output = *arg1 - *arg2;
    }
    break;
  case 6:
  }
  return;
}

Assistant:

static void DataTypeApplyOp(ImGuiDataType data_type, int op, void* output, void* arg1, const void* arg2)
{
    IM_ASSERT(op == '+' || op == '-');
    switch (data_type)
    {
        case ImGuiDataType_S32:
            if (op == '+')      *(int*)output = *(const int*)arg1 + *(const int*)arg2;
            else if (op == '-') *(int*)output = *(const int*)arg1 - *(const int*)arg2;
            return;
        case ImGuiDataType_U32:
            if (op == '+')      *(unsigned int*)output = *(const unsigned int*)arg1 + *(const ImU32*)arg2;
            else if (op == '-') *(unsigned int*)output = *(const unsigned int*)arg1 - *(const ImU32*)arg2;
            return;
        case ImGuiDataType_S64:
            if (op == '+')      *(ImS64*)output = *(const ImS64*)arg1 + *(const ImS64*)arg2;
            else if (op == '-') *(ImS64*)output = *(const ImS64*)arg1 - *(const ImS64*)arg2;
            return;
        case ImGuiDataType_U64:
            if (op == '+')      *(ImU64*)output = *(const ImU64*)arg1 + *(const ImU64*)arg2;
            else if (op == '-') *(ImU64*)output = *(const ImU64*)arg1 - *(const ImU64*)arg2;
            return;
        case ImGuiDataType_Float:
            if (op == '+')      *(float*)output = *(const float*)arg1 + *(const float*)arg2;
            else if (op == '-') *(float*)output = *(const float*)arg1 - *(const float*)arg2;
            return;
        case ImGuiDataType_Double:
            if (op == '+')      *(double*)output = *(const double*)arg1 + *(const double*)arg2;
            else if (op == '-') *(double*)output = *(const double*)arg1 - *(const double*)arg2;
            return;
        case ImGuiDataType_COUNT: break;
    }
    IM_ASSERT(0);
}